

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O0

void __thiscall HRSS_Poly3Invert_Test::TestBody(HRSS_Poly3Invert_Test *this)

{
  poly3 *ppVar1;
  poly3 *ppVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_00;
  bool bVar3;
  char *pcVar4;
  AssertHelper local_4a8;
  Message local_4a0;
  Bytes local_498;
  Bytes local_488;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_3;
  poly3 r_1;
  size_t i_1;
  Message local_3a8;
  Bytes local_3a0;
  Bytes local_390;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_2;
  Message local_368;
  Bytes local_360;
  Bytes local_350;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_1;
  Message local_328;
  Bytes local_320;
  Bytes local_310;
  undefined1 local_300 [8];
  AssertionResult gtest_ar;
  undefined1 local_2e0 [8];
  poly3 r;
  ulong uStack_228;
  ScopedTrace gtest_trace_54;
  size_t i;
  poly3 result;
  poly3 inverse;
  poly3 p;
  HRSS_Poly3Invert_Test *this_local;
  
  memset(inverse.a.v + 10,0,0xb0);
  memset(result.a.v + 10,0,0xb0);
  memset(&i,0,0xb0);
  inverse.a.v[10] = 0;
  for (uStack_228 = 0; uStack_228 < 700; uStack_228 = uStack_228 + 1) {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)((long)r.a.v + 0x57),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x36,&stack0xfffffffffffffdd8);
    ::OPENSSL_memset(local_2e0,0,0xb0);
    r.s.v[(uStack_228 >> 6) + 10] = 1L << ((byte)uStack_228 & 0x3f);
    HRSS_poly3_invert((poly3 *)(result.a.v + 10),(poly3 *)local_2e0);
    HRSS_poly3_mul((poly3 *)&i,(poly3 *)(result.a.v + 10),(poly3 *)local_2e0);
    Bytes::Bytes(&local_310,(uint8_t *)(inverse.a.v + 10),0xb0);
    Bytes::Bytes(&local_320,(uint8_t *)&i,0xb0);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_300,"Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p))",
               "Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result))",&local_310,
               &local_320);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
    if (!bVar3) {
      testing::Message::Message(&local_328);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x3f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_328);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_328);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)r.a.v + 0x57));
  }
  inverse.a.v[10] = 1;
  ppVar1 = (poly3 *)(result.a.v + 10);
  ppVar2 = (poly3 *)(inverse.a.v + 10);
  HRSS_poly3_invert(ppVar1,ppVar2);
  Bytes::Bytes(&local_350,(uint8_t *)ppVar2,0xb0);
  Bytes::Bytes(&local_360,(uint8_t *)ppVar1,0xb0);
  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
            ((EqHelper *)local_340,"Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p))",
             "Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse))",&local_350,
             &local_360);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar3) {
    testing::Message::Message(&local_368);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  inverse.a.v[10] = 0;
  ppVar1 = (poly3 *)(result.a.v + 10);
  ppVar2 = (poly3 *)(inverse.a.v + 10);
  HRSS_poly3_invert(ppVar1,ppVar2);
  Bytes::Bytes(&local_390,(uint8_t *)ppVar2,0xb0);
  Bytes::Bytes(&local_3a0,(uint8_t *)ppVar1,0xb0);
  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
            ((EqHelper *)local_380,"Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p))",
             "Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse))",&local_390,
             &local_3a0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar3) {
    testing::Message::Message(&local_3a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x4e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  for (r_1.a.v[10] = 0; r_1.a.v[10] < 500; r_1.a.v[10] = r_1.a.v[10] + 1) {
    p_00 = &gtest_ar_3.message_;
    poly3_rand((poly3 *)p_00);
    ppVar1 = (poly3 *)(result.a.v + 10);
    HRSS_poly3_invert(ppVar1,(poly3 *)p_00);
    HRSS_poly3_mul((poly3 *)&i,ppVar1,(poly3 *)p_00);
    Bytes::Bytes(&local_488,(uint8_t *)(inverse.a.v + 10),0xb0);
    Bytes::Bytes(&local_498,(uint8_t *)&i,0xb0);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_478,"Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p))",
               "Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result))",&local_488,
               &local_498);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
    if (!bVar3) {
      testing::Message::Message(&local_4a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
      testing::internal::AssertHelper::AssertHelper
                (&local_4a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x5c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
      testing::internal::AssertHelper::~AssertHelper(&local_4a8);
      testing::Message::~Message(&local_4a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  }
  return;
}

Assistant:

TEST(HRSS, Poly3Invert) {
  poly3 p, inverse, result;
  memset(&p, 0, sizeof(p));
  memset(&inverse, 0, sizeof(inverse));
  memset(&result, 0, sizeof(result));

  p.s.v[0] = 0;
  p.a.v[0] = 1;
  for (size_t i = 0; i < N - 1; i++) {
    SCOPED_TRACE(i);
    poly3 r;
    OPENSSL_memset(&r, 0, sizeof(r));
    r.a.v[i / BITS_PER_WORD] = (UINT64_C(1) << (i % BITS_PER_WORD));
    HRSS_poly3_invert(&inverse, &r);
    HRSS_poly3_mul(&result, &inverse, &r);
    // r×r⁻¹ = 1, and |p| contains 1.
    EXPECT_EQ(
        Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p)),
        Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result)));
  }

  // The inverse of -1 is -1.
  p.s.v[0] = 1;
  p.a.v[0] = 1;
  HRSS_poly3_invert(&inverse, &p);
  EXPECT_EQ(Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p)),
            Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse)));

  // The inverse of 1 is 1.
  p.s.v[0] = 0;
  p.a.v[0] = 1;
  HRSS_poly3_invert(&inverse, &p);
  EXPECT_EQ(Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p)),
            Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse)));

  for (size_t i = 0; i < 500; i++) {
    poly3 r;
    poly3_rand(&r);
    // Drop the term at x^700 because |HRSS_poly3_invert| only handles reduced
    // inputs.
    r.s.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
    r.a.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
    HRSS_poly3_invert(&inverse, &r);
    HRSS_poly3_mul(&result, &inverse, &r);
    // r×r⁻¹ = 1, and |p| contains 1.
    EXPECT_EQ(
        Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p)),
        Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result)));
  }
}